

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTreeEdge.cpp
# Opt level: O0

shared_ptr<Bipartition> __thiscall PhyloTreeEdge::getOriginalEdge(PhyloTreeEdge *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Bipartition> *in_RSI;
  element_type *in_RDI;
  shared_ptr<Bipartition> sVar1;
  
  std::shared_ptr<Bipartition>::shared_ptr(in_RSI,(shared_ptr<Bipartition> *)in_RDI);
  sVar1.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Bipartition>)sVar1.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const shared_ptr<Bipartition> PhyloTreeEdge::getOriginalEdge() {
    return originalEdge;
}